

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::addClause_(SimpSolver *this,vec<Minisat::Lit,_int> *ps)

{
  bool bVar1;
  Size SVar2;
  int iVar3;
  int iVar4;
  Lit LVar5;
  Lit *pLVar6;
  uint *puVar7;
  vec<unsigned_int,_int> *this_00;
  int *piVar8;
  char *pcVar9;
  int local_40;
  int local_3c;
  Clause *pCStack_38;
  int i_1;
  Clause *c;
  CRef cr;
  int nclauses;
  vec<Minisat::Lit,_int> *pvStack_20;
  int i;
  vec<Minisat::Lit,_int> *ps_local;
  SimpSolver *this_local;
  
  nclauses = 0;
  pvStack_20 = ps;
  ps_local = (vec<Minisat::Lit,_int> *)this;
  while( true ) {
    iVar3 = nclauses;
    SVar2 = vec<Minisat::Lit,_int>::size(pvStack_20);
    if (SVar2 <= iVar3) {
      c._4_4_ = vec<unsigned_int,_int>::size(&(this->super_Solver).clauses);
      if (((this->use_rcheck & 1U) == 0) || (bVar1 = implied(this,pvStack_20), !bVar1)) {
        bVar1 = Solver::addClause_(&this->super_Solver,pvStack_20);
        if (bVar1) {
          if (((this->use_simplification & 1U) != 0) &&
             (SVar2 = vec<unsigned_int,_int>::size(&(this->super_Solver).clauses),
             SVar2 == c._4_4_ + 1)) {
            puVar7 = vec<unsigned_int,_int>::last(&(this->super_Solver).clauses);
            c._0_4_ = *puVar7;
            pCStack_38 = ClauseAllocator::operator[](&(this->super_Solver).ca,(CRef)c);
            Queue<unsigned_int>::insert(&this->subsumption_queue,(CRef)c);
            for (local_3c = 0; iVar3 = local_3c, iVar4 = Clause::size(pCStack_38), iVar3 < iVar4;
                local_3c = local_3c + 1) {
              LVar5 = Clause::operator[](pCStack_38,local_3c);
              local_40 = var(LVar5);
              this_00 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                        ::operator[](&this->occurs,&local_40);
              vec<unsigned_int,_int>::push(this_00,(uint *)&c);
              LVar5 = Clause::operator[](pCStack_38,local_3c);
              piVar8 = IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::operator[]
                                 (&(this->n_occ).
                                   super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,LVar5);
              *piVar8 = *piVar8 + 1;
              LVar5 = Clause::operator[](pCStack_38,local_3c);
              iVar3 = var(LVar5);
              pcVar9 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                                 (&(this->touched).
                                   super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar3);
              *pcVar9 = '\x01';
              this->n_touched = this->n_touched + 1;
              LVar5 = Clause::operator[](pCStack_38,local_3c);
              iVar3 = var(LVar5);
              bVar1 = Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::inHeap
                                (&this->elim_heap,iVar3);
              if (bVar1) {
                LVar5 = Clause::operator[](pCStack_38,local_3c);
                iVar3 = var(LVar5);
                Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::increase
                          (&this->elim_heap,iVar3);
              }
            }
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = true;
      }
      return this_local._7_1_;
    }
    pLVar6 = vec<Minisat::Lit,_int>::operator[](pvStack_20,nclauses);
    cr = pLVar6->x;
    iVar3 = var((Lit)cr);
    bVar1 = isEliminated(this,iVar3);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    nclauses = nclauses + 1;
  }
  __assert_fail("!isEliminated(var(ps[i]))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/simp/SimpSolver.cc"
                ,0x98,"bool Minisat::SimpSolver::addClause_(vec<Lit> &)");
}

Assistant:

bool SimpSolver::addClause_(vec<Lit>& ps)
{
#ifndef NDEBUG
    for (int i = 0; i < ps.size(); i++)
        assert(!isEliminated(var(ps[i])));
#endif

    int nclauses = clauses.size();

    if (use_rcheck && implied(ps))
        return true;

    if (!Solver::addClause_(ps))
        return false;

    if (use_simplification && clauses.size() == nclauses + 1){
        CRef          cr = clauses.last();
        const Clause& c  = ca[cr];

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++){
            occurs[var(c[i])].push(cr);
            n_occ[c[i]]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i])))
                elim_heap.increase(var(c[i]));
        }
    }

    return true;
}